

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::EquivalentTypeCache::ClearUnusedTypes(EquivalentTypeCache *this,Recycler *recycler)

{
  Type *candidate;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  JitPolyEquivalentTypeGuard *this_00;
  uintptr_t uVar5;
  undefined1 *candidate_00;
  void *candidate_01;
  Type *pTVar6;
  ushort uVar7;
  int local_5c;
  int __i;
  Type *type_2;
  int i_1;
  bool isGuardValuePresent;
  uint16 nonNullIndex;
  Type *type_1;
  Type *type;
  intptr_t value;
  uint8 i;
  JitPolyEquivalentTypeGuard *polyGuard;
  bool isAnyTypeLive;
  Recycler *recycler_local;
  EquivalentTypeCache *this_local;
  
  polyGuard._7_1_ = false;
  if (this->guard == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x229e,"(this->guard)","this->guard");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = PropertyGuard::IsValid(this->guard);
  if (bVar2) {
    bVar2 = PropertyGuard::IsPoly(this->guard);
    if (bVar2) {
      this_00 = PropertyGuard::AsPolyTypeCheckGuard(this->guard);
      for (value._7_1_ = 0; uVar5 = JitPolyEquivalentTypeGuard::GetSize(this_00),
          value._7_1_ < uVar5; value._7_1_ = value._7_1_ + 1) {
        candidate_00 = (undefined1 *)JitPolyEquivalentTypeGuard::GetPolyValue(this_00,value._7_1_);
        if ((candidate_00 != &DAT_00000001) && (candidate_00 != (undefined1 *)0x2)) {
          bVar2 = Memory::Recycler::IsObjectMarked(recycler,candidate_00);
          if (bVar2) {
            polyGuard._7_1_ = true;
          }
          else {
            JitPolyEquivalentTypeGuard::InvalidateDuringSweep(this_00,value._7_1_);
          }
        }
      }
    }
    else {
      candidate_01 = (void *)PropertyGuard::GetValue(this->guard);
      polyGuard._7_1_ = Memory::Recycler::IsObjectMarked(recycler,candidate_01);
      if (!polyGuard._7_1_) {
        PropertyGuard::InvalidateDuringSweep(this->guard);
      }
    }
  }
  type_2._6_2_ = 0;
  bVar2 = false;
  type_2._0_4_ = 0;
  while( true ) {
    if (7 < (int)type_2) goto LAB_00a2f991;
    candidate = this->types[(int)type_2];
    if (candidate == (Type *)0x0) break;
    this->types[(int)type_2] = (Type *)0x0;
    bVar3 = Memory::Recycler::IsObjectMarked(recycler,candidate);
    if (bVar3) {
      uVar7 = type_2._6_2_ + 1;
      this->types[type_2._6_2_] = candidate;
      bVar3 = PropertyGuard::IsPoly(this->guard);
      type_2._6_2_ = uVar7;
      if (bVar3) {
        bVar2 = true;
      }
      else {
        pTVar6 = (Type *)PropertyGuard::GetValue(this->guard);
        if (pTVar6 == candidate) {
          bVar2 = true;
        }
      }
    }
    type_2._0_4_ = (int)type_2 + 1;
  }
  for (local_5c = (int)type_2; local_5c < 8; local_5c = local_5c + 1) {
    if (this->types[local_5c] != (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x22e1,"(this->types[__i] == nullptr)",
                                  "this->types[__i] == nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
LAB_00a2f991:
  if (type_2._6_2_ == 0) {
    bVar3 = PropertyGuard::IsPoly(this->guard);
    if (bVar3) {
      if (polyGuard._7_1_ == false) {
        PropertyGuard::Invalidate(this->guard);
      }
    }
    else {
      bVar3 = PropertyGuard::IsInvalidatedDuringSweep(this->guard);
      if (bVar3) {
        PropertyGuard::Invalidate(this->guard);
      }
    }
  }
  else {
    polyGuard._7_1_ = true;
  }
  bVar3 = PropertyGuard::IsValid(this->guard);
  if (((bVar3) && (!bVar2)) && (type_2._6_2_ != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x22fb,
                                "(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0)"
                                ,
                                "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return polyGuard._7_1_;
}

Assistant:

bool EquivalentTypeCache::ClearUnusedTypes(Recycler *recycler)
    {
        bool isAnyTypeLive = false;

        Assert(this->guard);
        if (this->guard->IsValid())
        {
            if (this->guard->IsPoly())
            {
                JitPolyEquivalentTypeGuard * polyGuard = this->guard->AsPolyTypeCheckGuard();
                for (uint8 i = 0; i < polyGuard->GetSize(); i++)
                {
                    intptr_t value = polyGuard->GetPolyValue(i);
                    if (value != PropertyGuard::GuardValue::Uninitialized && value != PropertyGuard::GuardValue::Invalidated_DuringSweep)
                    {
                        Type *type = reinterpret_cast<Type*>(value);
                        if (!recycler->IsObjectMarked(type))
                        {
                            polyGuard->InvalidateDuringSweep(i);
                        }
                        else
                        {
                            isAnyTypeLive = true;
                        }
                    }
                }
            }
            else
            {
                Type *type = reinterpret_cast<Type*>(this->guard->GetValue());
                if (!recycler->IsObjectMarked(type))
                {
                    this->guard->InvalidateDuringSweep();
                }
                else
                {
                    isAnyTypeLive = true;
                }
            }
        }
        uint16 nonNullIndex = 0;
#if DBG
        bool isGuardValuePresent = false;
#endif
        for (int i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
        {
            Type *type = this->types[i];
            if (type != nullptr)
            {
                this->types[i] = nullptr;
                if (recycler->IsObjectMarked(type))
                {
                    // compact the types array by moving non-null types
                    // to the beginning.
                    this->types[nonNullIndex++] = type;
#if DBG
                    if (guard->IsPoly())
                    {
                        isGuardValuePresent = true;
                    }
                    else if (this->guard->GetValue() == reinterpret_cast<intptr_t>(type))
                    {
                        isGuardValuePresent = true;
                    }
#endif
                }
            }
            else
            {
#ifdef DEBUG
                for (int __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                { Assert(this->types[__i] == nullptr); }
#endif
                break; // array must be shrinked already
            }
        }

        if (nonNullIndex > 0)
        {
            isAnyTypeLive = true;
        }
        else if (guard->IsPoly())
        {
            if (!isAnyTypeLive)
            {
                guard->Invalidate();
            }
        }
        else if (guard->IsInvalidatedDuringSweep())
        {
            // just mark this as actual invalidated since there are no types
            // present
            guard->Invalidate();
        }

        // verify if guard value is valid, it is present in one of the types
        AssertMsg(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0,
            "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types.");
        return isAnyTypeLive;
    }